

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMessageReflection *this,Message *message,
          FieldDescriptor *field)

{
  CppType CVar1;
  uint32 uVar2;
  string *psVar3;
  ArenaStringPtr *pAVar4;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar3 = ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        *(int *)(field + 0x38),*(string **)(field + 0xa0));
  }
  else {
    pAVar4 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    psVar3 = pAVar4->ptr_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  return __return_storage_ptr__;
}

Assistant:

string GeneratedMessageReflection::GetString(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return GetEmptyString();  // Make compiler happy.
  }
}